

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O3

bool is_invalid(char *s)

{
  int iVar1;
  char *pcVar2;
  char *__s;
  bool bVar3;
  
  iVar1 = cm_utf8_is_valid(s);
  bVar3 = iVar1 == 0;
  pcVar2 = "FAIL";
  if (bVar3) {
    pcVar2 = "pass";
  }
  __s = "expected invalid, reported as valid";
  if (bVar3) {
    __s = "invalid as expected";
  }
  printf("%s: validity bad  ",pcVar2);
  byte_array_print(s);
  putchar(0x20);
  puts(__s);
  return bVar3;
}

Assistant:

static bool is_invalid(const char* s)
{
  bool valid = cm_utf8_is_valid(s) != 0;
  if (valid) {
    report_invalid(false, s);
    printf("expected invalid, reported as valid\n");
    return false;
  }
  report_invalid(true, s);
  printf("invalid as expected\n");
  return true;
}